

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

prpnum prsrqpr(prscxdef *ctx)

{
  errcxdef *ctx_00;
  long in_RDI;
  prpnum ret;
  int unaff_retaddr;
  tokdef *tok;
  tokcxdef *in_stack_000000a8;
  undefined6 in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffee;
  prpnum pVar1;
  
  ctx_00 = (errcxdef *)(*(long *)(in_RDI + 8) + 0x120);
  if (*(int *)&ctx_00->errcxptr != 0x38) {
    errsigf(ctx_00,(char *)CONCAT26(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8),0);
  }
  if (*(char *)(*(long *)(in_RDI + 8) + 0x160) == '\0') {
    prsdef(ctx,tok,unaff_retaddr);
  }
  if (ctx_00->errcxbuf[0x24] != '\x03') {
    errsigf(ctx_00,(char *)CONCAT26(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8),0);
  }
  pVar1 = *(prpnum *)(ctx_00->errcxbuf + 0x26);
  toknext(in_stack_000000a8);
  return pVar1;
}

Assistant:

prpnum prsrqpr(prscxdef *ctx)
{
    tokdef *tok = &ctx->prscxtok->tokcxcur;
    prpnum  ret;
        
    /* make sure we get a symbol */
    if (tok->toktyp != TOKTSYMBOL)
        errsig(ctx->prscxerr, ERR_REQSYM);
    
    /* if it's an undefined symbol, make it a property id */
    if (tok->toksym.tokstyp == TOKSTUNK)
        prsdef(ctx, tok, TOKSTPROP);
    
    /* make sure we have a property */
    if (tok->toksym.tokstyp != TOKSTPROP)
        errsig(ctx->prscxerr, ERR_REQPRP);
    
    ret = tok->toksym.toksval;
    toknext(ctx->prscxtok);
    return(ret);
}